

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O0

void testRunner<false,false>(void)

{
  bool bVar1;
  int iVar2;
  IResultCapture *pIVar3;
  IContext *pIVar4;
  element_type *peVar5;
  string prev_directory;
  SQLLogicTestRunner runner;
  string storage_name;
  string initial_dbpath;
  string name;
  string *in_stack_00000d78;
  SQLLogicTestRunner *in_stack_00000d80;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *suffix;
  string local_4f8 [8];
  SQLLogicTestRunner *in_stack_fffffffffffffb10;
  string local_4d8 [32];
  string local_4b8 [273];
  byte local_3a7;
  undefined1 local_3a6;
  string *in_stack_fffffffffffffd08;
  SQLLogicTestRunner *in_stack_fffffffffffffd10;
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  undefined1 local_141 [33];
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_40 [32];
  string local_20 [32];
  
  pIVar3 = Catch::getResultCapture();
  (*pIVar3->_vptr_IResultCapture[0x15])(local_20);
  std::__cxx11::string::string(local_40);
  bVar1 = duckdb::TestForceStorage();
  if (bVar1) {
    std::__cxx11::string::string(local_90,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"/",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"_",&local_d9);
    duckdb::StringUtil::Replace(&local_70,local_90,local_b0,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::string(local_120,(string *)&local_70);
    suffix = (string *)local_141;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_141 + 1),".",(allocator *)suffix);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"_",&local_169);
    duckdb::StringUtil::Replace(local_100,local_120,local_141 + 1,local_168);
    std::__cxx11::string::operator=((string *)&local_70,local_100);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::string::~string((string *)(local_141 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_141);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::string(local_1b0,(string *)&local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"\\",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"_",&local_1f9);
    duckdb::StringUtil::Replace(local_190,local_1b0,local_1d0,local_1f8);
    __lhs = &local_70;
    this = local_190;
    std::__cxx11::string::operator=((string *)__lhs,this);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_1b0);
    std::operator+(__lhs,(char *)this);
    duckdb::TestCreatePath(suffix);
    std::__cxx11::string::operator=(local_40,local_220);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string(local_4b8,local_40);
  duckdb::SQLLogicTestRunner::SQLLogicTestRunner
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_4b8);
  pIVar4 = Catch::getCurrentContext();
  (*pIVar4->_vptr_IContext[4])();
  peVar5 = Catch::clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x7d4a6f);
  iVar2 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x17])();
  local_3a7 = (byte)iVar2 & 1;
  local_3a6 = 0;
  std::__cxx11::string::string(local_4d8);
  std::__cxx11::string::string(local_4f8,local_20);
  duckdb::SQLLogicTestRunner::ExecuteFile(in_stack_00000d80,in_stack_00000d78);
  std::__cxx11::string::~string(local_4f8);
  duckdb::ClearTestDirectory();
  std::__cxx11::string::~string(local_4d8);
  duckdb::SQLLogicTestRunner::~SQLLogicTestRunner(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

static void testRunner() {
	// this is an ugly hack that uses the test case name to pass the script file
	// name if someone has a better idea...
	auto name = Catch::getResultCapture().getCurrentTestName();
	// fprintf(stderr, "%s\n", name.c_str());
	string initial_dbpath;
	if (TestForceStorage()) {
		auto storage_name = StringUtil::Replace(name, "/", "_");
		storage_name = StringUtil::Replace(storage_name, ".", "_");
		storage_name = StringUtil::Replace(storage_name, "\\", "_");
		initial_dbpath = TestCreatePath(storage_name + ".db");
	}
	SQLLogicTestRunner runner(std::move(initial_dbpath));
	runner.output_sql = Catch::getCurrentContext().getConfig()->outputSQL();
	runner.enable_verification = VERIFICATION;

	string prev_directory;

	// We assume the test working dir for extensions to be one dir above the test/sql. Note that this is very hacky.
	// however for now it suffices: we use it to run tests from out-of-tree extensions that are based on the extension
	// template which adheres to this convention.
	if (AUTO_SWITCH_TEST_DIR) {
		prev_directory = TestGetCurrentDirectory();

		std::size_t found = name.rfind("test/sql");
		if (found == std::string::npos) {
			throw InvalidInputException("Failed to auto detect working dir for test '" + name +
			                            "' because a non-standard path was used!");
		}
		auto test_working_dir = name.substr(0, found);

		// Parse the test dir automatically
		TestChangeDirectory(test_working_dir);
	}

	runner.ExecuteFile(name);

	if (AUTO_SWITCH_TEST_DIR) {
		TestChangeDirectory(prev_directory);
	}

	// clear test directory after running tests
	ClearTestDirectory();
}